

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  ulong uVar1;
  i64 iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  u8 *puVar7;
  ulong iPos;
  u32 nData;
  long lVar8;
  u8 *puVar9;
  ulong iPos_00;
  u8 *puVar10;
  i64 iVar11;
  size_t sVar12;
  uint uVar13;
  int *piVar14;
  int iOff2;
  i64 iPrev;
  i64 iPos2;
  i64 iPos1;
  int iOff1;
  int local_ec;
  ulong local_e8;
  u8 *local_e0;
  ulong local_d8;
  ulong local_d0;
  Fts5Buffer local_c8;
  int local_b4;
  int *local_b0;
  long local_a8;
  ulong local_a0;
  Fts5Buffer *local_98;
  Fts5DoclistIter local_90;
  Fts5DoclistIter local_70;
  u8 *local_50;
  Fts5Buffer local_48;
  
  if (p2->n != 0) {
    local_48.p = (u8 *)0x0;
    local_48.n = 0;
    local_48.nSpace = 0;
    local_c8.p = (u8 *)0x0;
    local_c8.n = 0;
    local_c8.nSpace = 0;
    iVar3 = sqlite3Fts5BufferSize(&p->rc,&local_48,p2->n + p1->n + 0x1d);
    if (iVar3 == 0) {
      local_70.iRowid = 0;
      local_70.nPoslist = 0;
      local_70.nSize = 0;
      local_70.aPoslist = p1->p;
      local_70.aEof = local_70.aPoslist + p1->n;
      local_b0 = &p->rc;
      local_98 = p1;
      fts5DoclistIterNext(&local_70);
      local_90.nPoslist = 0;
      local_90.nSize = 0;
      local_90.iRowid = 0;
      local_90.aPoslist = p2->p;
      local_90.aEof = local_90.aPoslist + p2->n;
      fts5DoclistIterNext(&local_90);
      local_50 = local_48.p;
      lVar5 = 0;
      puVar9 = local_48.p;
      nData = local_48.n;
      do {
        while( true ) {
          while( true ) {
            puVar10 = local_70.aPoslist;
            iVar11 = local_70.iRowid;
            iVar2 = local_90.iRowid;
            if (local_90.iRowid <= local_70.iRowid) break;
            iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)nData,local_70.iRowid - lVar5);
            lVar5 = (long)local_70.nPoslist;
            lVar6 = (long)local_70.nSize;
            memcpy(puVar9 + (int)(nData + iVar3),local_70.aPoslist,lVar6 + lVar5);
            nData = nData + iVar3 + (int)(lVar6 + lVar5);
            fts5DoclistIterNext(&local_70);
            lVar5 = iVar11;
            puVar7 = local_90.aPoslist;
            if (local_70.aPoslist == (u8 *)0x0) goto LAB_001cd5db;
          }
          if (local_70.iRowid != local_90.iRowid) break;
          local_d0 = 0;
          local_d8 = 0;
          local_b4 = 0;
          local_ec = 0;
          lVar8 = (long)local_70.nSize;
          local_e0 = local_90.aPoslist;
          lVar6 = (long)local_90.nSize;
          local_e8 = 0;
          local_a8 = local_70.iRowid;
          iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)nData,local_70.iRowid - lVar5);
          piVar14 = local_b0;
          nData = nData + iVar3;
          local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
          iVar3 = local_70.nPoslist;
          local_a0 = local_90._24_8_ & 0xffffffff;
          sqlite3Fts5BufferSize(local_b0,&local_c8,local_90.nPoslist + local_70.nPoslist);
          puVar7 = local_e0;
          puVar9 = local_50;
          if (*piVar14 != 0) goto LAB_001cd58f;
          puVar10 = puVar10 + lVar8;
          puVar9 = local_e0 + lVar6;
          sqlite3Fts5PoslistNext64(puVar10,iVar3,&local_b4,(i64 *)&local_d0);
          local_e0 = puVar9;
          sqlite3Fts5PoslistNext64(puVar9,(int)local_a0,&local_ec,(i64 *)&local_d8);
          iPos = local_d0;
          iPos_00 = local_d8;
          if ((long)local_d0 < (long)local_d8) {
            sqlite3Fts5PoslistSafeAppend(&local_c8,(i64 *)&local_e8,local_d0);
            sqlite3Fts5PoslistNext64(puVar10,iVar3,&local_b4,(i64 *)&local_d0);
            iPos = local_d0;
          }
          else {
            sqlite3Fts5PoslistSafeAppend(&local_c8,(i64 *)&local_e8,local_d8);
            sqlite3Fts5PoslistNext64(local_e0,(int)local_a0,&local_ec,(i64 *)&local_d8);
            iPos_00 = local_d8;
          }
          uVar1 = iPos | iPos_00;
          while (-1 < (long)uVar1) {
            while ((long)iPos < (long)iPos_00) {
              if (iPos != local_e8) {
                sqlite3Fts5PoslistSafeAppend(&local_c8,(i64 *)&local_e8,iPos);
              }
              sqlite3Fts5PoslistNext64(puVar10,iVar3,&local_b4,(i64 *)&local_d0);
              iPos = local_d0;
              if ((long)local_d0 < 0) goto LAB_001cd4a0;
            }
            sqlite3Fts5PoslistSafeAppend(&local_c8,(i64 *)&local_e8,iPos_00);
            sqlite3Fts5PoslistNext64(local_e0,(int)local_a0,&local_ec,(i64 *)&local_d8);
            iPos_00 = local_d8;
            uVar1 = local_d8;
          }
          if ((long)iPos < 0) {
LAB_001cd4a0:
            sqlite3Fts5PoslistSafeAppend(&local_c8,(i64 *)&local_e8,iPos_00);
            puVar10 = local_e0 + local_ec;
            uVar13 = (int)local_a0 - local_ec;
          }
          else {
            if (iPos != local_e8) {
              sqlite3Fts5PoslistSafeAppend(&local_c8,(i64 *)&local_e8,iPos);
            }
            puVar10 = puVar10 + local_b4;
            uVar13 = iVar3 - local_b4;
          }
          puVar9 = local_50;
          puVar7 = local_c8.p;
          iVar3 = local_c8.n;
          if (0 < (int)uVar13) {
            memcpy(local_c8.p + local_c8.n,puVar10,(ulong)uVar13);
            iVar3 = iVar3 + uVar13;
            local_c8.n = iVar3;
          }
          iVar4 = sqlite3Fts5PutVarint(puVar9 + (int)nData,(long)(iVar3 * 2));
          memcpy(puVar9 + (int)(nData + iVar4),puVar7,(long)iVar3);
          nData = iVar3 + nData + iVar4;
          fts5DoclistIterNext(&local_70);
          fts5DoclistIterNext(&local_90);
          puVar7 = local_90.aPoslist;
          puVar10 = local_70.aPoslist;
          if ((local_70.aPoslist == (u8 *)0x0) || (lVar5 = local_a8, local_90.aPoslist == (u8 *)0x0)
             ) goto LAB_001cd58f;
        }
        iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)nData,local_90.iRowid - lVar5);
        lVar5 = (long)local_90.nPoslist;
        lVar6 = (long)local_90.nSize;
        memcpy(puVar9 + (int)(nData + iVar3),local_90.aPoslist,lVar6 + lVar5);
        nData = nData + iVar3 + (int)(lVar6 + lVar5);
        fts5DoclistIterNext(&local_90);
        lVar5 = iVar2;
      } while (local_90.aPoslist != (u8 *)0x0);
      puVar7 = (u8 *)0x0;
      local_a8 = iVar2;
      puVar10 = local_70.aPoslist;
LAB_001cd58f:
      piVar14 = local_b0;
      iVar11 = local_a8;
      if (puVar10 == (u8 *)0x0) {
LAB_001cd5db:
        piVar14 = local_b0;
        if (puVar7 != (u8 *)0x0) {
          iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)nData,local_90.iRowid - iVar11);
          sVar12 = (long)local_90.aEof - (long)puVar7;
          memcpy(puVar9 + (int)(nData + iVar3),puVar7,sVar12);
          nData = nData + iVar3 + (int)sVar12;
        }
      }
      else {
        iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)nData,local_70.iRowid - local_a8);
        sVar12 = (long)local_70.aEof - (long)puVar10;
        memcpy(puVar9 + (int)(nData + iVar3),puVar10,sVar12);
        nData = nData + iVar3 + (int)sVar12;
      }
      local_98->n = 0;
      sqlite3Fts5BufferAppendBlob(piVar14,local_98,nData,puVar9);
      sqlite3_free(local_c8.p);
      sqlite3_free(puVar9);
    }
  }
  return;
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  if( p2->n ){
    i64 iLastRowid = 0;
    Fts5DoclistIter i1;
    Fts5DoclistIter i2;
    Fts5Buffer out = {0, 0, 0};
    Fts5Buffer tmp = {0, 0, 0};

    /* The maximum size of the output is equal to the sum of the two 
    ** input sizes + 1 varint (9 bytes). The extra varint is because if the
    ** first rowid in one input is a large negative number, and the first in
    ** the other a non-negative number, the delta for the non-negative
    ** number will be larger on disk than the literal integer value
    ** was.  
    **
    ** Or, if the input position-lists are corrupt, then the output might
    ** include up to 2 extra 10-byte positions created by interpreting -1
    ** (the value PoslistNext64() uses for EOF) as a position and appending
    ** it to the output. This can happen at most once for each input 
    ** position-list, hence two 10 byte paddings.  */
    if( sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n + 9+10+10) ) return;
    fts5DoclistIterInit(p1, &i1);
    fts5DoclistIterInit(p2, &i2);

    while( 1 ){
      if( i1.iRowid<i2.iRowid ){
        /* Copy entry from i1 */
        fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
        fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.nPoslist+i1.nSize);
        fts5DoclistIterNext(&i1);
        if( i1.aPoslist==0 ) break;
        assert( out.n<=((i1.aPoslist-p1->p) + (i2.aPoslist-p2->p)+9+10+10) );
      }
      else if( i2.iRowid!=i1.iRowid ){
        /* Copy entry from i2 */
        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.nPoslist+i2.nSize);
        fts5DoclistIterNext(&i2);
        if( i2.aPoslist==0 ) break;
        assert( out.n<=((i1.aPoslist-p1->p) + (i2.aPoslist-p2->p)+9+10+10) );
      }
      else{
        /* Merge the two position lists. */ 
        i64 iPos1 = 0;
        i64 iPos2 = 0;
        int iOff1 = 0;
        int iOff2 = 0;
        u8 *a1 = &i1.aPoslist[i1.nSize];
        u8 *a2 = &i2.aPoslist[i2.nSize];
        int nCopy;
        u8 *aCopy;

        i64 iPrev = 0;
        Fts5PoslistWriter writer;
        memset(&writer, 0, sizeof(writer));

        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferZero(&tmp);
        sqlite3Fts5BufferSize(&p->rc, &tmp, i1.nPoslist + i2.nPoslist);
        if( p->rc ) break;

        sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        assert_nc( iPos1>=0 && iPos2>=0 );

        if( iPos1<iPos2 ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        }else{
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        }
        if( iPos1>=0 && iPos2>=0 ){
          while( 1 ){
            if( iPos1<iPos2 ){
              if( iPos1!=iPrev ){
                sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
              }
              sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
              if( iPos1<0 ) break;
            }else{
              assert_nc( iPos2!=iPrev );
              sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
              sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
              if( iPos2<0 ) break;
            }
          }
        }

        if( iPos1>=0 ){
          if( iPos1!=iPrev ){
            sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          }
          aCopy = &a1[iOff1];
          nCopy = i1.nPoslist - iOff1;
        }else{
          assert_nc( iPos2>=0 && iPos2!=iPrev );
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          aCopy = &a2[iOff2];
          nCopy = i2.nPoslist - iOff2;
        }
        if( nCopy>0 ){
          fts5BufferSafeAppendBlob(&tmp, aCopy, nCopy);
        }

        /* WRITEPOSLISTSIZE */
        fts5BufferSafeAppendVarint(&out, tmp.n * 2);
        fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
        fts5DoclistIterNext(&i1);
        fts5DoclistIterNext(&i2);
        assert_nc( out.n<=(p1->n+p2->n+9) );
        if( i1.aPoslist==0 || i2.aPoslist==0 ) break;
        assert( out.n<=((i1.aPoslist-p1->p) + (i2.aPoslist-p2->p)+9+10+10) );
      }
    }

    if( i1.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
      fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.aEof - i1.aPoslist);
    }
    else if( i2.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
      fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.aEof - i2.aPoslist);
    }
    assert_nc( out.n<=(p1->n+p2->n+9) );

    fts5BufferSet(&p->rc, p1, out.n, out.p);
    fts5BufferFree(&tmp);
    fts5BufferFree(&out);
  }
}